

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::fragment_sections::key(fragment_sections *this,string *s)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  error_code eVar4;
  undefined1 local_32e;
  undefined1 local_32d;
  undefined1 local_32c;
  section_kind local_32b [19];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_318;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
  local_48;
  
  if ((key(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&key(std::__cxx11::string_const&)::map_abi_cxx11_), iVar1 != 0)) {
    local_32b[0x12] = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
              (&local_318,(char (*) [5])"text",local_32b + 0x12);
    local_32b[0x11] = 1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[5],_pstore::repo::section_kind,_true>
              (&local_2f0,(char (*) [5])0x13f061,local_32b + 0x11);
    local_32b[0x10] = 2;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[4],_pstore::repo::section_kind,_true>
              (&local_2c8,(char (*) [4])0x13f482,local_32b + 0x10);
    local_32b[0xf] = 3;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[7],_pstore::repo::section_kind,_true>
              (&local_2a0,(char (*) [7])"rel_ro",local_32b + 0xf);
    local_32b[0xe] = 4;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (&local_278,(char (*) [26])"mergeable_1_byte_c_string",local_32b + 0xe);
    local_32b[0xd] = 5;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (&local_250,(char (*) [26])"mergeable_2_byte_c_string",local_32b + 0xd);
    local_32b[0xc] = 6;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[26],_pstore::repo::section_kind,_true>
              (&local_228,(char (*) [26])"mergeable_4_byte_c_string",local_32b + 0xc);
    local_32b[0xb] = 7;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
              (&local_200,(char (*) [18])"mergeable_const_4",local_32b + 0xb);
    local_32b[10] = 8;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[18],_pstore::repo::section_kind,_true>
              (&local_1d8,(char (*) [18])"mergeable_const_8",local_32b + 10);
    local_32b[9] = 9;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (&local_1b0,(char (*) [19])"mergeable_const_16",local_32b + 9);
    local_32b[8] = 10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (&local_188,(char (*) [19])"mergeable_const_32",local_32b + 8);
    local_32b[7] = 0xb;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
              (&local_160,(char (*) [10])"read_only",local_32b + 7);
    local_32b[6] = 0xc;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[12],_pstore::repo::section_kind,_true>
              (&local_138,(char (*) [12])"thread_data",local_32b + 6);
    local_32b[5] = 0xd;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
              (&local_110,(char (*) [11])"thread_bss",local_32b + 5);
    local_32b[4] = 0xe;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[11],_pstore::repo::section_kind,_true>
              (&local_e8,(char (*) [11])0x13f77f,local_32b + 4);
    local_32b[3] = 0xf;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[10],_pstore::repo::section_kind,_true>
              (&local_c0,(char (*) [10])"debug_loc",local_32b + 3);
    local_32b[2] = 0x10;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
              (&local_98,(char (*) [13])"debug_string",local_32b + 2);
    local_32b[1] = 0x11;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[13],_pstore::repo::section_kind,_true>
              (&local_70,(char (*) [13])"debug_ranges",local_32b + 1);
    local_32b[0] = linked_definitions;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>
    ::pair<const_char_(&)[19],_pstore::repo::section_kind,_true>
              (&local_48,(char (*) [19])"linked_definitions",local_32b);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,pstore::repo::section_kind>,std::allocator<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,pstore::repo::section_kind>,std::allocator<std::pair<std::__cxx11::string_const,pstore::repo::section_kind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&key(std::__cxx11::string_const&)::map_abi_cxx11_,&local_318,
               &stack0xffffffffffffffe0,0,&local_32c,&local_32d,&local_32e);
    lVar3 = 0x2d0;
    do {
      std::__cxx11::string::~string((string *)((long)&local_318.first._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != -0x28);
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>_>
                 ::~unordered_map,&key(std::__cxx11::string_const&)::map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&key(std::__cxx11::string_const&)::map_abi_cxx11_);
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&key(std::__cxx11::string_const&)::map_abi_cxx11_._M_h,s);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
      ._M_cur == (__node_type *)0x0) {
switchD_0011ffa8_default:
    eVar4 = make_error_code(unknown_section_name);
  }
  else {
    switch(*(undefined1 *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::repo::section_kind>,_true>
                   ._M_cur + 0x28)) {
    case 0:
      eVar4 = create_section_importer<(pstore::repo::section_kind)0>(this);
      break;
    case 1:
      eVar4 = create_section_importer<(pstore::repo::section_kind)1>(this);
      break;
    case 2:
      eVar4 = create_section_importer<(pstore::repo::section_kind)2>(this);
      break;
    case 3:
      eVar4 = create_section_importer<(pstore::repo::section_kind)3>(this);
      break;
    case 4:
      eVar4 = create_section_importer<(pstore::repo::section_kind)4>(this);
      break;
    case 5:
      eVar4 = create_section_importer<(pstore::repo::section_kind)5>(this);
      break;
    case 6:
      eVar4 = create_section_importer<(pstore::repo::section_kind)6>(this);
      break;
    case 7:
      eVar4 = create_section_importer<(pstore::repo::section_kind)7>(this);
      break;
    case 8:
      eVar4 = create_section_importer<(pstore::repo::section_kind)8>(this);
      break;
    case 9:
      eVar4 = create_section_importer<(pstore::repo::section_kind)9>(this);
      break;
    case 10:
      eVar4 = create_section_importer<(pstore::repo::section_kind)10>(this);
      break;
    case 0xb:
      eVar4 = create_section_importer<(pstore::repo::section_kind)11>(this);
      break;
    case 0xc:
      eVar4 = create_section_importer<(pstore::repo::section_kind)12>(this);
      break;
    case 0xd:
      eVar4 = create_section_importer<(pstore::repo::section_kind)13>(this);
      break;
    case 0xe:
      eVar4 = create_section_importer<(pstore::repo::section_kind)14>(this);
      break;
    case 0xf:
      eVar4 = create_section_importer<(pstore::repo::section_kind)15>(this);
      break;
    case 0x10:
      eVar4 = create_section_importer<(pstore::repo::section_kind)16>(this);
      break;
    case 0x11:
      eVar4 = create_section_importer<(pstore::repo::section_kind)17>(this);
      break;
    case 0x12:
      eVar4 = create_section_importer<(pstore::repo::section_kind)18>(this);
      break;
    case 0x13:
      assert_failed("false && \"Illegal section kind\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                    ,0x86);
    default:
      goto switchD_0011ffa8_default;
    }
  }
  return eVar4;
}

Assistant:

std::error_code fragment_sections::key (std::string const & s) {
                using repo::section_kind;

#define X(a) {#a, section_kind::a},
                static std::unordered_map<std::string, section_kind> const map{
                    PSTORE_MCREPO_SECTION_KINDS};
#undef X
                auto const pos = map.find (s);
                if (pos == map.end ()) {
                    return error::unknown_section_name;
                }

#define X(a)                                                                                       \
    case section_kind::a: return this->create_section_importer<section_kind::a> ();
                switch (pos->second) {
                    PSTORE_MCREPO_SECTION_KINDS
                case section_kind::last:
                    PSTORE_ASSERT (false && "Illegal section kind"); // unreachable
                }
#undef X
                return error::unknown_section_name;
            }